

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_decoder.cc
# Opt level: O2

Status * __thiscall
draco::PlyDecoder::DecodeFromBuffer
          (Status *__return_storage_ptr__,PlyDecoder *this,DecoderBuffer *buffer,Mesh *out_mesh)

{
  this->out_mesh_ = out_mesh;
  DecodeFromBuffer(__return_storage_ptr__,this,buffer,&out_mesh->super_PointCloud);
  return __return_storage_ptr__;
}

Assistant:

Status PlyDecoder::DecodeFromBuffer(DecoderBuffer *buffer, Mesh *out_mesh) {
  out_mesh_ = out_mesh;
  return DecodeFromBuffer(buffer, static_cast<PointCloud *>(out_mesh));
}